

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ReduceLogSumExpLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_reducelogsumexp(NeuralNetworkLayer *this)

{
  bool bVar1;
  ReduceLogSumExpLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_reducelogsumexp(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_reducelogsumexp(this);
    this_00 = (ReduceLogSumExpLayerParams *)operator_new(0x30);
    ReduceLogSumExpLayerParams::ReduceLogSumExpLayerParams(this_00);
    (this->layer_).reducelogsumexp_ = this_00;
  }
  return (ReduceLogSumExpLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ReduceLogSumExpLayerParams* NeuralNetworkLayer::mutable_reducelogsumexp() {
  if (!has_reducelogsumexp()) {
    clear_layer();
    set_has_reducelogsumexp();
    layer_.reducelogsumexp_ = new ::CoreML::Specification::ReduceLogSumExpLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.reduceLogSumExp)
  return layer_.reducelogsumexp_;
}